

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EntityIdentifier.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LE_EntityIdentifier *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Site:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8SiteID);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Application: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8ApplicationID);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Object:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16EntityID);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString LE_EntityIdentifier::GetAsString() const
{
    KStringStream ss;

    ss << "Site:        " << ( KUINT16 )m_ui8SiteID           << "\n"
       << "Application: " << ( KUINT16 )m_ui8ApplicationID    << "\n"
       << "Object:      " << m_ui16EntityID                   << "\n";

    return ss.str();
}